

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc.cpp
# Opt level: O3

void enhanceContrastLinearly
               (Image *src,Histogram *src_hist,Image *dest,int low,int high,int channel)

{
  uint uVar1;
  uint uVar2;
  domain_error *this;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (((src == (Image *)0x0) || (src_hist == (Histogram *)0x0)) || (dest == (Image *)0x0)) {
    __assert_fail("(src != nullptr) && (src_hist != nullptr) && (dest != nullptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/imgproc.cpp"
                  ,0x58,
                  "void enhanceContrastLinearly(const Image *, const Histogram *, Image *, int, int, int)"
                 );
  }
  uVar9 = src->width;
  if (uVar9 == dest->width) {
    uVar7 = src->height;
    if (uVar7 == dest->height) {
      if ((uint)channel < 4) {
        uVar6 = src_hist->range;
        if ((int)uVar6 < 1) {
          uVar2 = 0;
          uVar5 = 0;
        }
        else {
          uVar2 = 0;
          uVar5 = 0;
          do {
            if (low < (src_hist->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6 * channel + uVar2]) break;
            bVar8 = (char)uVar5 + 1;
            uVar5 = (ulong)bVar8;
            uVar2 = (uint)bVar8;
          } while (uVar2 < uVar6);
          if ((char)uVar5 == -1) {
            uVar4 = 0xff;
            bVar8 = 0xff;
            uVar3 = 0xff;
            goto LAB_00112330;
          }
        }
        bVar8 = (byte)uVar5;
        uVar3 = 0xff;
        uVar1 = 0xfe;
        do {
          uVar4 = uVar1;
          if (high < (src_hist->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)(int)(uVar6 * channel) + uVar3]) {
            uVar4 = (uint)uVar3;
            goto LAB_00112330;
          }
          uVar3 = uVar3 - 1;
          uVar1 = uVar4 - 1;
        } while (bVar8 < (byte)uVar3);
        uVar4 = uVar4 & 0xff;
        uVar3 = uVar5;
LAB_00112330:
        if (uVar7 != 0) {
          uVar5 = (ulong)(uint)channel;
          uVar6 = 0;
          do {
            uVar1 = 0;
            if (uVar9 != 0) {
              uVar7 = 0;
              do {
                if (src->height <= uVar6) {
                  __assert_fail("(x < width) && (y < height)",
                                "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                                ,0x33,"Pixel Image::operator()(int, int) const");
                }
                local_2c = *(undefined4 *)src->pixels[uVar9 * uVar6 + uVar7].colors;
                if (*(byte *)((long)&local_2c + uVar5) < bVar8) {
                  if ((dest->width <= uVar7) || (dest->height <= uVar6)) goto LAB_00112463;
                  dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] = '\0';
                }
                else {
                  local_30 = local_2c;
                  if ((byte)uVar3 < *(byte *)((long)&local_30 + uVar5)) {
                    if ((dest->width <= uVar7) || (dest->height <= uVar6)) {
LAB_00112463:
                      __assert_fail("(x < width) && (y < height)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/acstud[P]lab2/src/baseline/../utils/Image.hpp"
                                    ,0x3e,"Pixel &Image::operator()(int, int)");
                    }
                    dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] = 0xff;
                  }
                  else {
                    local_34 = local_2c;
                    if ((dest->width <= uVar7) || (dest->height <= uVar6)) goto LAB_00112463;
                    dest->pixels[dest->width * uVar6 + uVar7].colors[uVar5] =
                         (uchar)(int)((float)(int)(*(byte *)((long)&local_34 + uVar5) - uVar2) *
                                      255.0 * (1.0 / (float)(int)(uVar4 - uVar2)));
                  }
                }
                uVar7 = uVar7 + 1;
                uVar9 = src->width;
              } while (uVar7 < uVar9);
              uVar7 = src->height;
              uVar1 = uVar9;
            }
            uVar9 = uVar1;
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar7);
        }
        return;
      }
      this = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error(this,"Color channel must be 0,1,2 or 3.");
      goto LAB_001124fa;
    }
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,"Source and destination image are not of equal dimensions.");
LAB_001124fa:
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void enhanceContrastLinearly(const Image *src, const Histogram *src_hist, Image *dest, int low, int high, int channel) {
  // Check arguments
  assert((src != nullptr) && (src_hist != nullptr) && (dest != nullptr));
  checkDimensionsEqualOrThrow(src, dest);
  checkValidColorChannelOrThrow(channel);

  unsigned char first = 0;
  unsigned char last = 255;

  // Obtain the first intensity that is above the threshold.
  for (first = 0; first < src_hist->range; first++) {
    if (src_hist->count(first, channel) > low) {
      break;
    }
  }

  // Obtain the first intensity that is above the threshold.
  for (last = 255; last > first; last--) {
    if (src_hist->count(last, channel) > high) {
      break;
    }
  }

  // Obtain the scaling factor and offset.
  float scale = 255.0f / (last - first);
  auto offset = first;

  // For every pixel
  for (int y = 0; y < src->height; y++) {
    for (int x = 0; x < src->width; x++) {
      // Clamp anything above and below the threshold to 0...255
      if (src->pixel(x, y).colors[channel] < first) {
        dest->pixel(x, y).colors[channel] = 0;
      } else if (src->pixel(x, y).colors[channel] > last) {
        dest->pixel(x, y).colors[channel] = 255;
      } else {
        // Anything else is scaled
        dest->pixel(x, y).colors[channel] = (unsigned char) (scale * (src->pixel(x, y).colors[channel] - offset));
      }
    }
  }

}